

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DExporter.cpp
# Opt level: O3

void __thiscall
Assimp::X3DExporter::Export_Material(X3DExporter *this,size_t pIdxMaterial,size_t pTabLevel)

{
  _Rb_tree_header *p_Var1;
  size_t pTabLevel_00;
  aiScene *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  aiScene **ppaVar4;
  aiMaterial *pMat;
  pointer pcVar5;
  bool bVar6;
  float fVar7;
  ulong __val;
  char cVar8;
  aiReturn aVar9;
  _Base_ptr p_Var10;
  undefined8 *puVar11;
  _Node *p_Var12;
  mapped_type *pmVar13;
  Logger *this_00;
  long *plVar14;
  _Base_ptr p_Var15;
  ulong uVar16;
  size_type *psVar17;
  aiVector2D *pAttrDefaultValue;
  char cVar18;
  undefined8 uVar19;
  X3DExporter *pXVar20;
  _Alloc_hider _Var21;
  aiScene **ppaVar22;
  list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_> attr_list;
  float tvalf;
  anon_class_16_2_65aab299 Color4ToAttrList;
  aiColor4D color4;
  string material_name;
  aiColor4D c;
  aiString ai_mat_name;
  _List_base<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
  local_938;
  float local_91c;
  SAttribute local_918;
  undefined1 local_8d8 [8];
  list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
  *plStack_8d0;
  undefined1 local_8c8 [16];
  aiColor3D local_8b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_8a8;
  size_t local_898;
  aiColor3D local_890;
  aiScene **local_880;
  long local_878;
  aiScene *local_870;
  undefined8 uStack_868;
  ulong local_860;
  float local_854;
  float local_850;
  float local_84c;
  undefined1 local_848 [5];
  undefined1 auStack_843 [3];
  IOStream *pIStack_840;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_838;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_828;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_818 [62];
  undefined1 local_438 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_428;
  _Alloc_hider local_418;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_408 [61];
  
  local_938._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&local_938;
  local_938._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_938;
  local_938._M_impl._M_node._M_size = 0;
  p_Var10 = (this->mDEF_Map_Material)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  pMat = this->mScene->mMaterials[pIdxMaterial];
  local_898 = pTabLevel;
  local_860 = pIdxMaterial;
  if (p_Var10 == (_Base_ptr)0x0) {
LAB_0035a532:
    pcVar5 = local_438 + 0x10;
    local_938._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_938;
    local_938._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&local_938;
    local_438._0_8_ = pcVar5;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_438,"_IDX_","");
    __val = local_860;
    cVar18 = '\x01';
    if (9 < local_860) {
      uVar16 = local_860;
      cVar8 = '\x04';
      do {
        cVar18 = cVar8;
        if (uVar16 < 100) {
          cVar18 = cVar18 + -2;
          goto LAB_0035a6e1;
        }
        if (uVar16 < 1000) {
          cVar18 = cVar18 + -1;
          goto LAB_0035a6e1;
        }
        if (uVar16 < 10000) goto LAB_0035a6e1;
        bVar6 = 99999 < uVar16;
        uVar16 = uVar16 / 10000;
        cVar8 = cVar18 + '\x04';
      } while (bVar6);
      cVar18 = cVar18 + '\x01';
    }
LAB_0035a6e1:
    _local_848 = (pointer)&local_838;
    std::__cxx11::string::_M_construct((ulong)local_848,cVar18);
    std::__detail::__to_chars_10_impl<unsigned_long>(_local_848,(uint)pIStack_840._0_4_,__val);
    paVar2 = (aiScene *)((long)&pIStack_840->_vptr_IOStream + local_438._8_8_);
    uVar19 = (aiScene *)0xf;
    if ((pointer)local_438._0_8_ != pcVar5) {
      uVar19 = local_428._M_allocated_capacity;
    }
    if ((ulong)uVar19 < paVar2) {
      uVar19 = (aiScene *)0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_local_848 != &local_838) {
        uVar19 = local_838._M_allocated_capacity;
      }
      if ((ulong)uVar19 < paVar2) goto LAB_0035a767;
      puVar11 = (undefined8 *)
                std::__cxx11::string::replace((ulong)local_848,0,(char *)0x0,local_438._0_8_);
    }
    else {
LAB_0035a767:
      puVar11 = (undefined8 *)std::__cxx11::string::_M_append(local_438,(ulong)_local_848);
    }
    local_880 = &local_870;
    ppaVar22 = (aiScene **)(puVar11 + 2);
    if ((aiScene **)*puVar11 == ppaVar22) {
      local_870 = *ppaVar22;
      uStack_868 = puVar11[3];
    }
    else {
      local_870 = *ppaVar22;
      local_880 = (aiScene **)*puVar11;
    }
    local_878 = puVar11[1];
    *puVar11 = ppaVar22;
    puVar11[1] = 0;
    *(undefined1 *)ppaVar22 = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_local_848 != &local_838) {
      operator_delete(_local_848,(ulong)(local_838._M_allocated_capacity + 1));
    }
    if ((pointer)local_438._0_8_ != pcVar5) {
      operator_delete((void *)local_438._0_8_,(ulong)(local_428._M_allocated_capacity + 1));
    }
    local_438._0_8_ = local_438._0_8_ & 0xffffff0000000000;
    memset(local_438 + 5,0x1b,0x3ff);
    aVar9 = aiGetMaterialString(pMat,"?mat.name",0,0,(aiString *)local_438);
    if (aVar9 == aiReturn_SUCCESS) {
      strlen(local_438 + 4);
      std::__cxx11::string::replace((ulong)&local_880,0,(char *)0x0,(ulong)(local_438 + 4));
    }
    _local_848 = (pointer)&local_838;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_848,"DEF","");
    local_828._M_allocated_capacity = (size_type)local_818;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_828,local_880,(undefined1 *)(local_878 + (long)local_880));
    p_Var12 = std::__cxx11::
              list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
              ::_M_create_node<Assimp::X3DExporter::SAttribute>
                        ((list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
                          *)&local_938,(SAttribute *)local_848);
    std::__detail::_List_node_base::_M_hook(&p_Var12->super__List_node_base);
    local_938._M_impl._M_node._M_size = local_938._M_impl._M_node._M_size + 1;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_828._M_allocated_capacity != local_818) {
      operator_delete((void *)local_828._M_allocated_capacity,local_818[0]._M_allocated_capacity + 1
                     );
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_local_848 != &local_838) {
      operator_delete(_local_848,(ulong)(local_838._M_allocated_capacity + 1));
    }
    pmVar13 = std::
              map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](&this->mDEF_Map_Material,&local_860);
    std::__cxx11::string::_M_assign((string *)pmVar13);
    _local_848 = (pointer)&local_838;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_848,"Appearance","");
    NodeHelper_OpenNode(this,(string *)local_848,local_898,false,
                        (list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
                         *)&local_938);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_local_848 != &local_838) {
      operator_delete(_local_848,(ulong)(local_838._M_allocated_capacity + 1));
    }
    std::__cxx11::
    _List_base<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>::
    _M_clear(&local_938);
    local_938._M_impl._M_node._M_size = 0;
    local_8b8.r = 0.0;
    local_8b8.g = 0.0;
    local_8b8.b = 0.0;
    local_8d8 = (undefined1  [8])0x0;
    plStack_8d0 = (list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
                   *)0x0;
    _local_848 = (pointer)0x0;
    pIStack_840 = (IOStream *)0x0;
    local_938._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_938;
    local_938._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&local_938;
    local_918.Name._M_dataplus._M_p = (pointer)this;
    local_918.Name._M_string_length = (size_type)&local_938;
    aVar9 = aiGetMaterialColor(pMat,"$clr.ambient",0,0,(aiColor4D *)local_848);
    if (aVar9 == aiReturn_SUCCESS) {
      pXVar20 = (X3DExporter *)local_848;
      local_84c = (float)local_848._0_4_;
      local_854 = stack0xfffffffffffff7bc;
      local_850 = pIStack_840._0_4_;
      _local_848 = (pointer)&local_838;
      std::__cxx11::string::_M_construct<char_const*>((string *)pXVar20,"ambientIntensity","");
      AttrHelper_FloatToAttrList
                (pXVar20,(list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
                          *)&local_938,(string *)local_848,(local_84c + local_854 + local_850) / 3.0
                 ,0.2);
LAB_0035aaf4:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_local_848 != &local_838) {
        operator_delete(_local_848,(ulong)(local_838._M_allocated_capacity + 1));
      }
    }
    else {
      aVar9 = aiGetMaterialColor(pMat,"$clr.ambient",0,0,(aiColor4D *)local_8d8);
      if (aVar9 == aiReturn_SUCCESS) {
        pXVar20 = (X3DExporter *)local_848;
        _local_848 = (pointer)&local_838;
        std::__cxx11::string::_M_construct<char_const*>((string *)pXVar20,"ambientIntensity","");
        AttrHelper_FloatToAttrList
                  (pXVar20,(list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
                            *)&local_938,(string *)local_848,
                   ((float)local_8d8._0_4_ + (float)local_8d8._4_4_ + plStack_8d0._0_4_) / 3.0,0.2);
        goto LAB_0035aaf4;
      }
    }
    _local_848 = (pointer)0x0;
    pIStack_840 = (IOStream *)0x0;
    aVar9 = aiGetMaterialColor(pMat,"$clr.diffuse",0,0,(aiColor4D *)local_848);
    local_8b8._0_8_ = _local_848;
    local_8b8.b = pIStack_840._0_4_;
    if (aVar9 == aiReturn_SUCCESS) {
      pXVar20 = (X3DExporter *)local_848;
      _local_848 = (pointer)&local_838;
      std::__cxx11::string::_M_construct<char_const*>((string *)pXVar20,"diffuseColor","");
      local_890.r = 0.8;
      local_890.g = 0.8;
      local_890.b = 0.8;
      AttrHelper_Color3ToAttrList
                (pXVar20,(list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
                          *)&local_938,(string *)local_848,&local_8b8,&local_890);
LAB_0035ac20:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_local_848 != &local_838) {
        operator_delete(_local_848,(ulong)(local_838._M_allocated_capacity + 1));
      }
    }
    else {
      aVar9 = aiGetMaterialColor(pMat,"$clr.diffuse",0,0,(aiColor4D *)local_8d8);
      if (aVar9 == aiReturn_SUCCESS) {
        _local_848 = (pointer)&local_838;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_848,"diffuseColor","");
        local_890.r = 0.8;
        local_890.g = 0.8;
        local_890.b = 0.8;
        Export_Material::anon_class_16_2_65aab299::operator()
                  ((anon_class_16_2_65aab299 *)&local_918,(string *)local_848,(aiColor4D *)local_8d8
                   ,&local_890);
        goto LAB_0035ac20;
      }
    }
    _local_848 = (pointer)0x0;
    pIStack_840 = (IOStream *)0x0;
    aVar9 = aiGetMaterialColor(pMat,"$clr.emissive",0,0,(aiColor4D *)local_848);
    local_8b8._0_8_ = _local_848;
    local_8b8.b = pIStack_840._0_4_;
    if (aVar9 == aiReturn_SUCCESS) {
      pXVar20 = (X3DExporter *)local_848;
      _local_848 = (pointer)&local_838;
      std::__cxx11::string::_M_construct<char_const*>((string *)pXVar20,"emissiveColor","");
      local_890.r = 0.0;
      local_890.g = 0.0;
      local_890.b = 0.0;
      AttrHelper_Color3ToAttrList
                (pXVar20,(list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
                          *)&local_938,(string *)local_848,&local_8b8,&local_890);
LAB_0035ad41:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_local_848 != &local_838) {
        operator_delete(_local_848,(ulong)(local_838._M_allocated_capacity + 1));
      }
    }
    else {
      aVar9 = aiGetMaterialColor(pMat,"$clr.emissive",0,0,(aiColor4D *)local_8d8);
      if (aVar9 == aiReturn_SUCCESS) {
        _local_848 = (pointer)&local_838;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_848,"emissiveColor","");
        local_890.r = 0.0;
        local_890.g = 0.0;
        local_890.b = 0.0;
        Export_Material::anon_class_16_2_65aab299::operator()
                  ((anon_class_16_2_65aab299 *)&local_918,(string *)local_848,(aiColor4D *)local_8d8
                   ,&local_890);
        goto LAB_0035ad41;
      }
    }
    aVar9 = aiGetMaterialFloatArray(pMat,"$mat.shininess",0,0,&local_91c,(uint *)0x0);
    if (aVar9 == aiReturn_SUCCESS) {
      pXVar20 = (X3DExporter *)local_848;
      _local_848 = (pointer)&local_838;
      std::__cxx11::string::_M_construct<char_const*>((string *)pXVar20,"shininess","");
      AttrHelper_FloatToAttrList
                (pXVar20,(list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
                          *)&local_938,(string *)local_848,local_91c,0.2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_local_848 != &local_838) {
        operator_delete(_local_848,(ulong)(local_838._M_allocated_capacity + 1));
      }
    }
    _local_848 = (pointer)0x0;
    pIStack_840 = (IOStream *)0x0;
    aVar9 = aiGetMaterialColor(pMat,"$clr.specular",0,0,(aiColor4D *)local_848);
    local_8b8._0_8_ = _local_848;
    local_8b8.b = pIStack_840._0_4_;
    if (aVar9 == aiReturn_SUCCESS) {
      pXVar20 = (X3DExporter *)local_848;
      _local_848 = (pointer)&local_838;
      std::__cxx11::string::_M_construct<char_const*>((string *)pXVar20,"specularColor","");
      local_890.r = 0.0;
      local_890.g = 0.0;
      local_890.b = 0.0;
      AttrHelper_Color3ToAttrList
                (pXVar20,(list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
                          *)&local_938,(string *)local_848,&local_8b8,&local_890);
LAB_0035aeda:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_local_848 != &local_838) {
        operator_delete(_local_848,(ulong)(local_838._M_allocated_capacity + 1));
      }
    }
    else {
      aVar9 = aiGetMaterialColor(pMat,"$clr.specular",0,0,(aiColor4D *)local_8d8);
      if (aVar9 == aiReturn_SUCCESS) {
        _local_848 = (pointer)&local_838;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_848,"specularColor","");
        local_890.r = 0.0;
        local_890.g = 0.0;
        local_890.b = 0.0;
        Export_Material::anon_class_16_2_65aab299::operator()
                  ((anon_class_16_2_65aab299 *)&local_918,(string *)local_848,(aiColor4D *)local_8d8
                   ,&local_890);
        goto LAB_0035aeda;
      }
    }
    aVar9 = aiGetMaterialFloatArray(pMat,"$mat.opacity",0,0,&local_91c,(uint *)0x0);
    if (aVar9 == aiReturn_SUCCESS) {
      fVar7 = 1.0;
      if (local_91c <= 1.0) {
        fVar7 = local_91c;
      }
      local_91c = 1.0 - fVar7;
      pXVar20 = (X3DExporter *)local_848;
      _local_848 = (pointer)&local_838;
      std::__cxx11::string::_M_construct<char_const*>((string *)pXVar20,"transparency","");
      AttrHelper_FloatToAttrList
                (pXVar20,(list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
                          *)&local_938,(string *)local_848,local_91c,0.0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_local_848 != &local_838) {
        operator_delete(_local_848,(ulong)(local_838._M_allocated_capacity + 1));
      }
    }
    _local_848 = (pointer)&local_838;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_848,"Material","");
    pTabLevel_00 = local_898 + 1;
    NodeHelper_OpenNode(this,(string *)local_848,pTabLevel_00,true,
                        (list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
                         *)&local_938);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_local_848 != &local_838) {
      operator_delete(_local_848,(ulong)(local_838._M_allocated_capacity + 1));
    }
    std::__cxx11::
    _List_base<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>::
    _M_clear(&local_938);
    local_938._M_impl._M_node._M_size = 0;
    _local_848 = _local_848 & 0xffffff0000000000;
    local_938._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_938;
    local_938._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&local_938;
    memset(local_848 + 5,0x1b,0x3ff);
    aVar9 = aiGetMaterialString(pMat,"$tex.file",1,0,(aiString *)local_848);
    if (aVar9 == aiReturn_SUCCESS) {
      if (local_848[4] == '*') {
        paVar3 = &local_918.Name.field_2;
        local_918.Name._M_dataplus._M_p = (pointer)paVar3;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_918,"Embedded texture is not supported","");
        this_00 = DefaultLogger::get();
        Logger::error(this_00,local_918.Name._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_918.Name._M_dataplus._M_p != paVar3) {
          local_8a8._M_allocated_capacity =
               CONCAT44(local_918.Name.field_2._M_allocated_capacity._4_4_,
                        local_918.Name.field_2._M_allocated_capacity._0_4_);
          _Var21._M_p = local_918.Name._M_dataplus._M_p;
LAB_0035b222:
          operator_delete(_Var21._M_p,local_8a8._M_allocated_capacity + 1);
        }
      }
      else {
        local_918.Name._M_dataplus._M_p = (pointer)&local_918.Name.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_918,"url","");
        local_8b8._0_8_ = &local_8a8;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_8b8,"\"","");
        plVar14 = (long *)std::__cxx11::string::append((char *)&local_8b8);
        local_8d8 = (undefined1  [8])local_8c8;
        pXVar20 = (X3DExporter *)(plVar14 + 2);
        if ((X3DExporter *)*plVar14 == pXVar20) {
          local_8c8._0_8_ = pXVar20->mScene;
          local_8c8._8_8_ = plVar14[3];
        }
        else {
          local_8c8._0_8_ = pXVar20->mScene;
          local_8d8 = (undefined1  [8])*plVar14;
        }
        plStack_8d0 = (list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
                       *)plVar14[1];
        *plVar14 = (long)pXVar20;
        plVar14[1] = 0;
        *(undefined1 *)(plVar14 + 2) = 0;
        plVar14 = (long *)std::__cxx11::string::append(local_8d8);
        paVar3 = &local_918.Value.field_2;
        psVar17 = (size_type *)(plVar14 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar14 ==
            (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)psVar17) {
          local_918.Value.field_2._M_allocated_capacity = *psVar17;
          local_918.Value.field_2._8_8_ = plVar14[3];
          local_918.Value._M_dataplus._M_p = (pointer)paVar3;
        }
        else {
          local_918.Value.field_2._M_allocated_capacity = *psVar17;
          local_918.Value._M_dataplus._M_p = (pointer)*plVar14;
        }
        local_918.Value._M_string_length = plVar14[1];
        *plVar14 = (long)psVar17;
        plVar14[1] = 0;
        *(undefined1 *)(plVar14 + 2) = 0;
        p_Var12 = std::__cxx11::
                  list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
                  ::_M_create_node<Assimp::X3DExporter::SAttribute>
                            ((list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
                              *)&local_938,&local_918);
        std::__detail::_List_node_base::_M_hook(&p_Var12->super__List_node_base);
        local_938._M_impl._M_node._M_size = local_938._M_impl._M_node._M_size + 1;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_918.Value._M_dataplus._M_p != paVar3) {
          operator_delete(local_918.Value._M_dataplus._M_p,
                          local_918.Value.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_918.Name._M_dataplus._M_p != &local_918.Name.field_2) {
          operator_delete(local_918.Name._M_dataplus._M_p,
                          CONCAT44(local_918.Name.field_2._M_allocated_capacity._4_4_,
                                   local_918.Name.field_2._M_allocated_capacity._0_4_) + 1);
        }
        if (local_8d8 != (undefined1  [8])local_8c8) {
          operator_delete((void *)local_8d8,(ulong)((long)(uint *)local_8c8._0_8_ + 1));
        }
        _Var21._M_p = (pointer)local_8b8._0_8_;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_8b8._0_8_ != &local_8a8) goto LAB_0035b222;
      }
    }
    aVar9 = aiGetMaterialProperty(pMat,"$tex.mapmodeu",1,0,(aiMaterialProperty **)&local_918);
    if (((aVar9 == aiReturn_SUCCESS) && (*(int *)(local_918.Name._M_dataplus._M_p + 0x40c) != 0)) &&
       (*(int *)(local_918.Name._M_dataplus._M_p + 0x410) == 5)) {
      paVar3 = &local_918.Name.field_2;
      local_918.Name._M_dataplus._M_p = (pointer)paVar3;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_918,"repeatS","");
      Export_Material::anon_class_8_1_15d7a4cc::operator()
                ((anon_class_8_1_15d7a4cc *)&local_938,(string *)local_918.Name._M_dataplus._M_p,
                 SUB81(local_918.Name._M_string_length,0));
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_918.Name._M_dataplus._M_p != paVar3) {
        operator_delete(local_918.Name._M_dataplus._M_p,
                        CONCAT44(local_918.Name.field_2._M_allocated_capacity._4_4_,
                                 local_918.Name.field_2._M_allocated_capacity._0_4_) + 1);
      }
    }
    aVar9 = aiGetMaterialProperty(pMat,"$tex.mapmodev",1,0,(aiMaterialProperty **)&local_918);
    if (((aVar9 == aiReturn_SUCCESS) && (*(int *)(local_918.Name._M_dataplus._M_p + 0x40c) != 0)) &&
       (*(int *)(local_918.Name._M_dataplus._M_p + 0x410) == 5)) {
      paVar3 = &local_918.Name.field_2;
      local_918.Name._M_dataplus._M_p = (pointer)paVar3;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_918,"repeatT","");
      Export_Material::anon_class_8_1_15d7a4cc::operator()
                ((anon_class_8_1_15d7a4cc *)&local_938,(string *)local_918.Name._M_dataplus._M_p,
                 SUB81(local_918.Name._M_string_length,0));
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_918.Name._M_dataplus._M_p != paVar3) {
        operator_delete(local_918.Name._M_dataplus._M_p,
                        CONCAT44(local_918.Name.field_2._M_allocated_capacity._4_4_,
                                 local_918.Name.field_2._M_allocated_capacity._0_4_) + 1);
      }
    }
    paVar3 = &local_918.Name.field_2;
    local_918.Name._M_dataplus._M_p = (pointer)paVar3;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_918,"ImageTexture","");
    NodeHelper_OpenNode(this,&local_918.Name,pTabLevel_00,true,
                        (list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
                         *)&local_938);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_918.Name._M_dataplus._M_p != paVar3) {
      operator_delete(local_918.Name._M_dataplus._M_p,
                      CONCAT44(local_918.Name.field_2._M_allocated_capacity._4_4_,
                               local_918.Name.field_2._M_allocated_capacity._0_4_) + 1);
    }
    std::__cxx11::
    _List_base<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>::
    _M_clear(&local_938);
    local_938._M_impl._M_node._M_size = 0;
    local_918.Name._M_dataplus._M_p = (pointer)0x0;
    local_918.Name._M_string_length = 0x3f8000003f800000;
    local_918.Name.field_2._M_allocated_capacity._0_4_ = 0.0;
    pAttrDefaultValue = (aiVector2D *)0x0;
    local_938._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_938;
    local_938._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&local_938;
    local_8d8 = (undefined1  [8])this;
    plStack_8d0 = (list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
                   *)&local_938;
    aVar9 = aiGetMaterialUVTransform(pMat,"$tex.uvtrafo",1,0,(aiUVTransform *)&local_918);
    if (aVar9 == aiReturn_SUCCESS) {
      _local_848 = (pointer)&local_838;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_848,"translation","");
      Export_Material::anon_class_16_2_65aab299::operator()
                ((anon_class_16_2_65aab299 *)local_8d8,(string *)local_848,(aiVector2D *)&local_918,
                 pAttrDefaultValue);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_local_848 != &local_838) {
        operator_delete(_local_848,(ulong)(local_838._M_allocated_capacity + 1));
      }
      pXVar20 = (X3DExporter *)local_848;
      _local_848 = (pointer)&local_838;
      std::__cxx11::string::_M_construct<char_const*>((string *)pXVar20,"rotation","");
      AttrHelper_FloatToAttrList
                (pXVar20,(list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
                          *)&local_938,(string *)local_848,
                 (float)local_918.Name.field_2._M_allocated_capacity._0_4_,0.0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_local_848 != &local_838) {
        operator_delete(_local_848,(ulong)(local_838._M_allocated_capacity + 1));
      }
      _local_848 = (pointer)&local_838;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_848,"scale","");
      Export_Material::anon_class_16_2_65aab299::operator()
                ((anon_class_16_2_65aab299 *)local_8d8,(string *)local_848,
                 (aiVector2D *)&local_918.Name._M_string_length,pAttrDefaultValue);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_local_848 != &local_838) {
        operator_delete(_local_848,(ulong)(local_838._M_allocated_capacity + 1));
      }
      _local_848 = (pointer)&local_838;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_848,"TextureTransform","");
      NodeHelper_OpenNode(this,(string *)local_848,pTabLevel_00,true,
                          (list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
                           *)&local_938);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_local_848 != &local_838) {
        operator_delete(_local_848,(ulong)(local_838._M_allocated_capacity + 1));
      }
      std::__cxx11::
      _List_base<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
      ::_M_clear(&local_938);
      local_938._M_impl._M_node._M_size = 0;
      local_938._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_938;
      local_938._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)&local_938;
    }
    _local_848 = (pointer)&local_838;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_848,"Appearance","");
    NodeHelper_CloseNode(this,(string *)local_848,local_898);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_local_848 != &local_838) {
      operator_delete(_local_848,(ulong)(local_838._M_allocated_capacity + 1));
    }
    local_428._M_allocated_capacity = (size_type)local_870;
    ppaVar22 = local_880;
    if (local_880 == &local_870) goto LAB_0035b50d;
  }
  else {
    p_Var1 = &(this->mDEF_Map_Material)._M_t._M_impl.super__Rb_tree_header;
    p_Var15 = &p_Var1->_M_header;
    do {
      if (*(ulong *)(p_Var10 + 1) >= pIdxMaterial) {
        p_Var15 = p_Var10;
      }
      p_Var10 = (&p_Var10->_M_left)[*(ulong *)(p_Var10 + 1) < pIdxMaterial];
    } while (p_Var10 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var15 == p_Var1) || (pIdxMaterial < *(ulong *)(p_Var15 + 1)))
    goto LAB_0035a532;
    ppaVar4 = (aiScene **)(local_438 + 0x10);
    local_438._0_8_ = ppaVar4;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_438,"USE","");
    pmVar13 = std::
              map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::at(&this->mDEF_Map_Material,&local_860);
    pcVar5 = (pmVar13->_M_dataplus)._M_p;
    local_418._M_p = (pointer)local_408;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_418,pcVar5,pcVar5 + pmVar13->_M_string_length);
    p_Var12 = std::__cxx11::
              list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
              ::_M_create_node<Assimp::X3DExporter::SAttribute>
                        ((list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
                          *)&local_938,(SAttribute *)local_438);
    std::__detail::_List_node_base::_M_hook(&p_Var12->super__List_node_base);
    local_938._M_impl._M_node._M_size = local_938._M_impl._M_node._M_size + 1;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_418._M_p != local_408) {
      operator_delete(local_418._M_p,local_408[0]._M_allocated_capacity + 1);
    }
    if ((aiScene **)local_438._0_8_ != ppaVar4) {
      operator_delete((void *)local_438._0_8_,(ulong)(local_428._M_allocated_capacity + 1));
    }
    local_438._0_8_ = ppaVar4;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_438,"Appearance","");
    NodeHelper_OpenNode(this,(string *)local_438,local_898,true,
                        (list<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>
                         *)&local_938);
    ppaVar22 = (aiScene **)local_438._0_8_;
    if ((aiScene **)local_438._0_8_ == ppaVar4) goto LAB_0035b50d;
  }
  operator_delete(ppaVar22,(ulong)((long)&((aiScene *)local_428._M_allocated_capacity)->mFlags + 1))
  ;
LAB_0035b50d:
  std::__cxx11::
  _List_base<Assimp::X3DExporter::SAttribute,_std::allocator<Assimp::X3DExporter::SAttribute>_>::
  _M_clear(&local_938);
  return;
}

Assistant:

void X3DExporter::Export_Material(const size_t pIdxMaterial, const size_t pTabLevel)
{
const char* NodeName_A = "Appearance";

list<SAttribute> attr_list;
aiMaterial& material = *mScene->mMaterials[pIdxMaterial];// create alias for conveniance.

	// Check if material already defined early.
	if(mDEF_Map_Material.find(pIdxMaterial) != mDEF_Map_Material.end())
	{
		// Material already defined, just refer to it
		attr_list.push_back({"USE", mDEF_Map_Material.at(pIdxMaterial)});
		NodeHelper_OpenNode(NodeName_A, pTabLevel, true, attr_list);

		return;
	}

	string material_name(string("_IDX_") + to_string(pIdxMaterial));// Create material name
	aiString ai_mat_name;

	if(material.Get(AI_MATKEY_NAME, ai_mat_name) == AI_SUCCESS) material_name.insert(0, ai_mat_name.C_Str());

	// Define material name.
	attr_list.push_back({"DEF", material_name});
	mDEF_Map_Material[pIdxMaterial] = material_name;

	//
	// "Appearance" node.
	//
	NodeHelper_OpenNode(NodeName_A, pTabLevel, false, attr_list);
	attr_list.clear();

	//
	// "Material" node.
	//
	{
		auto Color4ToAttrList = [&](const string& pAttrName, const aiColor4D& pAttrValue, const aiColor3D& pAttrDefaultValue)
		{
			string tstr;

			if(aiColor3D(pAttrValue.r, pAttrValue.g, pAttrValue.b) != pAttrDefaultValue)
			{
				AttrHelper_Col4DArrToString(&pAttrValue, 1, tstr);
				attr_list.push_back({pAttrName, tstr});
			}
		};

		float tvalf;
		aiColor3D color3;
		aiColor4D color4;

		// ambientIntensity="0.2"     SFFloat [inputOutput]
		if(material.Get(AI_MATKEY_COLOR_AMBIENT, color3) == AI_SUCCESS)
			AttrHelper_FloatToAttrList(attr_list, "ambientIntensity", (color3.r + color3.g + color3.b) / 3.0f, 0.2f);
		else if(material.Get(AI_MATKEY_COLOR_AMBIENT, color4) == AI_SUCCESS)
			AttrHelper_FloatToAttrList(attr_list, "ambientIntensity", (color4.r + color4.g + color4.b) / 3.0f, 0.2f);

		// diffuseColor="0.8 0.8 0.8" SFColor [inputOutput]
		if(material.Get(AI_MATKEY_COLOR_DIFFUSE, color3) == AI_SUCCESS)
			AttrHelper_Color3ToAttrList(attr_list, "diffuseColor", color3, aiColor3D(0.8f, 0.8f, 0.8f));
		else if(material.Get(AI_MATKEY_COLOR_DIFFUSE, color4) == AI_SUCCESS)
			Color4ToAttrList("diffuseColor", color4, aiColor3D(0.8f, 0.8f, 0.8f));

		// emissiveColor="0 0 0"      SFColor [inputOutput]
		if(material.Get(AI_MATKEY_COLOR_EMISSIVE, color3) == AI_SUCCESS)
			AttrHelper_Color3ToAttrList(attr_list, "emissiveColor", color3, aiColor3D(0, 0, 0));
		else if(material.Get(AI_MATKEY_COLOR_EMISSIVE, color4) == AI_SUCCESS)
			Color4ToAttrList("emissiveColor", color4, aiColor3D(0, 0, 0));

		// shininess="0.2"            SFFloat [inputOutput]
		if(material.Get(AI_MATKEY_SHININESS, tvalf) == AI_SUCCESS) AttrHelper_FloatToAttrList(attr_list, "shininess", tvalf, 0.2f);

		// specularColor="0 0 0"      SFColor [inputOutput]
		if(material.Get(AI_MATKEY_COLOR_SPECULAR, color3) == AI_SUCCESS)
			AttrHelper_Color3ToAttrList(attr_list, "specularColor", color3, aiColor3D(0, 0, 0));
		else if(material.Get(AI_MATKEY_COLOR_SPECULAR, color4) == AI_SUCCESS)
			Color4ToAttrList("specularColor", color4, aiColor3D(0, 0, 0));

		// transparency="0"           SFFloat [inputOutput]
		if(material.Get(AI_MATKEY_OPACITY, tvalf) == AI_SUCCESS)
		{
			if(tvalf > 1) tvalf = 1;

			tvalf = 1.0f - tvalf;
			AttrHelper_FloatToAttrList(attr_list, "transparency", tvalf, 0);
		}

		NodeHelper_OpenNode("Material", pTabLevel + 1, true, attr_list);
		attr_list.clear();
	}// "Material" node. END.

	//
	// "ImageTexture" node.
	//
	{
		auto RepeatToAttrList = [&](const string& pAttrName, const bool pAttrValue)
		{
			if(!pAttrValue) attr_list.push_back({pAttrName, "false"});
		};

		bool tvalb;
		aiString tstring;

		// url=""         MFString
		if(material.Get(AI_MATKEY_TEXTURE_DIFFUSE(0), tstring) == AI_SUCCESS)
		{
			if(strncmp(tstring.C_Str(), AI_EMBEDDED_TEXNAME_PREFIX, strlen(AI_EMBEDDED_TEXNAME_PREFIX)) == 0)
				LogError("Embedded texture is not supported");
			else
				attr_list.push_back({"url", string("\"") + tstring.C_Str() + "\""});
		}

		// repeatS="true" SFBool
		if(material.Get(AI_MATKEY_MAPPINGMODE_U_DIFFUSE(0), tvalb) == AI_SUCCESS) RepeatToAttrList("repeatS", tvalb);

		// repeatT="true" SFBool
		if(material.Get(AI_MATKEY_MAPPINGMODE_V_DIFFUSE(0), tvalb) == AI_SUCCESS) RepeatToAttrList("repeatT", tvalb);

		NodeHelper_OpenNode("ImageTexture", pTabLevel + 1, true, attr_list);
		attr_list.clear();
	}// "ImageTexture" node. END.

	//
	// "TextureTransform" node.
	//
	{
		auto Vec2ToAttrList = [&](const string& pAttrName, const aiVector2D& pAttrValue, const aiVector2D& pAttrDefaultValue)
		{
			string tstr;

			if(pAttrValue != pAttrDefaultValue)
			{
				AttrHelper_Vec2DArrToString(&pAttrValue, 1, tstr);
				attr_list.push_back({pAttrName, tstr});
			}
		};

		aiUVTransform transform;

		if(material.Get(AI_MATKEY_UVTRANSFORM_DIFFUSE(0), transform) == AI_SUCCESS)
		{
			Vec2ToAttrList("translation", transform.mTranslation, aiVector2D(0, 0));
			AttrHelper_FloatToAttrList(attr_list, "rotation", transform.mRotation, 0);
			Vec2ToAttrList("scale", transform.mScaling, aiVector2D(1, 1));

			NodeHelper_OpenNode("TextureTransform", pTabLevel + 1, true, attr_list);
			attr_list.clear();
		}
	}// "TextureTransform" node. END.

	//
	// Close opened nodes.
	//
	NodeHelper_CloseNode(NodeName_A, pTabLevel);

}